

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O2

int lreplace(RSIZE plen,char *st)

{
  byte *pbVar1;
  ushort *puVar2;
  int iVar3;
  byte *__s;
  size_t sVar4;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  ushort uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  line *plVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  int local_38;
  
  iVar3 = checkdirty(curbp);
  if (iVar3 == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      __s = (byte *)strdup(st);
      if (__s != (byte *)0x0) {
        sVar4 = strlen((char *)__s);
        undo_boundary_enable(8,0);
        backchar(0xf,plen);
        local_38 = (int)sVar4;
        if (casereplace == 1) {
          plVar12 = curwp->w_dotp;
          pcVar7 = plVar12->l_text;
          if (pcVar7 != (char *)0x0) {
            uVar11 = (ulong)curwp->w_doto;
            ppuVar5 = __ctype_b_loc();
            puVar2 = *ppuVar5;
            pbVar1 = (byte *)(pcVar7 + uVar11);
            bVar15 = true;
            bVar14 = true;
            if ((puVar2[*pbVar1] >> 8 & 1) != 0) {
              uVar8 = 1;
              for (iVar3 = 0; (uVar8 != 0 && (iVar3 < plen)); iVar3 = iVar3 + 1) {
                uVar8 = puVar2[(byte)plVar12->l_text[(int)uVar11]] >> 8 & 1;
                if ((puVar2[(byte)plVar12->l_text[(int)uVar11]] >> 10 & 1) == 0) {
                  uVar8 = 1;
                }
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
                if (uVar10 == plVar12->l_used) {
                  plVar12 = plVar12->l_fp;
                  iVar3 = iVar3 + 1;
                  uVar11 = 0;
                }
              }
              bVar14 = uVar8 == 0;
            }
            lVar9 = 0;
            while ((lVar9 < local_38 && (bVar15))) {
              bVar15 = (*(byte *)((long)puVar2 + (ulong)__s[lVar9] * 2 + 1) & 1) == 0;
              lVar9 = lVar9 + 1;
            }
            if (bVar15) {
              if (bVar14) {
                if ((puVar2[*pbVar1] >> 8 & 1) != 0) {
                  pp_Var6 = __ctype_toupper_loc();
                  *__s = *(byte *)(*pp_Var6 + *__s);
                }
              }
              else {
                uVar11 = 0;
                uVar13 = 0;
                if (0 < local_38) {
                  uVar13 = sVar4 & 0xffffffff;
                }
                for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
                  pp_Var6 = __ctype_toupper_loc();
                  __s[uVar11] = *(byte *)(*pp_Var6 + __s[uVar11]);
                }
              }
            }
          }
        }
        ldelete(plen,0);
        region_put_data((char *)__s,local_38);
        lchange(8);
        undo_boundary_enable(8,1);
        free(__s);
        return 1;
      }
      dobeep();
      pcVar7 = "out of memory";
    }
    else {
      dobeep();
      pcVar7 = "Buffer is read only";
    }
    iVar3 = 0;
    ewprintf(pcVar7);
  }
  return iVar3;
}

Assistant:

int
lreplace(RSIZE plen, char *st)
{
	RSIZE	rlen;	/* replacement length		 */
	struct line *lp;
	RSIZE n;
	int s, doto, is_query_capitalised = 0, is_query_allcaps = 0;
	int is_replace_alllower = 0;
	char *repl = NULL;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	if ((repl = strdup(st)) == NULL) {
		dobeep();
		ewprintf("out of memory");
		return (FALSE);
	}
	rlen = strlen(repl);

	undo_boundary_enable(FFRAND, 0);
	(void)backchar(FFARG | FFRAND, (int)plen);

	if (casereplace != TRUE)
		goto done;

	lp = curwp->w_dotp;
	if (ltext(lp) == NULL)
		goto done;
	doto = curwp->w_doto;
	n = plen;

	is_query_capitalised = isupper((unsigned char)lgetc(lp, doto));

	if (is_query_capitalised) {
		for (n = 0, is_query_allcaps = 1; n < plen && is_query_allcaps;
		    n++) {
			is_query_allcaps = !isalpha((unsigned char)lgetc(lp,
			    doto)) || isupper((unsigned char)lgetc(lp, doto));
			doto++;
			if (doto == llength(lp)) {
				doto = 0;
				lp = lforw(lp);
				n++; /* \n is implicit in the buffer */
			}
		}
	}

	for (n = 0, is_replace_alllower = 1; n < rlen && is_replace_alllower;
	    n++)
		is_replace_alllower = !isupper((unsigned char)repl[n]);

	if (is_replace_alllower) {
		if (is_query_allcaps) {
			for (n = 0; n < rlen; n++)
				repl[n] = toupper((unsigned char)repl[n]);
		} else if (is_query_capitalised) {
			repl[0] = toupper((unsigned char)repl[0]);
		}
	}

 done:
	(void)ldelete(plen, KNONE);
	region_put_data(repl, rlen);
	lchange(WFFULL);

	undo_boundary_enable(FFRAND, 1);

	free(repl);
	return (TRUE);
}